

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vocabulary.cpp
# Opt level: O0

void __thiscall Vocabulary::Vocabulary(Vocabulary *this,string *file_path)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  istream *piVar4;
  mapped_type *pmVar5;
  reference pvVar6;
  ostream *poVar7;
  size_type sVar8;
  Node local_440;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_410;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_408;
  iterator token_search;
  stringstream ss;
  string local_278 [8];
  string token;
  string local_258 [8];
  string line;
  istream local_228 [8];
  fstream fs;
  string *file_path_local;
  Vocabulary *this_local;
  
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::unordered_map(&this->node2Id);
  std::vector<Node,_std::allocator<Node>_>::vector(&this->vocab_items);
  std::fstream::fstream(local_228,(string *)file_path,_S_in);
  bVar1 = std::fstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar7 = std::operator<<((ostream *)&std::cout,"An error occurred during reading file.");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::__cxx11::string::string(local_258);
    std::__cxx11::string::string(local_278);
    this->total_nodes = 0;
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_228,local_258);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar2) break;
      _Var3 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream((stringstream *)&token_search,local_258,_Var3);
      while( true ) {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&token_search,local_278,' ');
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
        if (!bVar2) break;
        local_408._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find(&this->node2Id,(key_type *)local_278);
        local_410._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::end(&this->node2Id);
        bVar2 = std::__detail::operator==(&local_408,&local_410);
        if (bVar2) {
          sVar8 = std::vector<Node,_std::allocator<Node>_>::size(&this->vocab_items);
          pmVar5 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[](&this->node2Id,(key_type *)local_278);
          *pmVar5 = (mapped_type)sVar8;
          Node::Node(&local_440,(string *)local_278);
          std::vector<Node,_std::allocator<Node>_>::push_back(&this->vocab_items,&local_440);
          Node::~Node(&local_440);
        }
        pmVar5 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&this->node2Id,(key_type *)local_278);
        pvVar6 = std::vector<Node,_std::allocator<Node>_>::operator[]
                           (&this->vocab_items,(long)*pmVar5);
        pvVar6->count = pvVar6->count + 1;
        this->total_nodes = this->total_nodes + 1;
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&token_search);
    }
    std::fstream::close();
    std::__cxx11::string::~string(local_278);
    std::__cxx11::string::~string(local_258);
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"--> The input file has been successfully read!");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)&std::cout,"    + The total number of nodes: ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->total_nodes);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)&std::cout,"    + The total number of distinct nodes: ");
  sVar8 = std::vector<Node,_std::allocator<Node>_>::size(&this->vocab_items);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar8);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::fstream::~fstream(local_228);
  return;
}

Assistant:

Vocabulary::Vocabulary(string file_path) {

    fstream fs(file_path, fstream::in);
    if(fs.is_open()) {

        string line, token;

        total_nodes = 0;
        while( getline(fs, line) ) {
            stringstream ss(line);
            while( getline(ss, token, ' ') ) {

                // if the node was not added before
                auto token_search = node2Id.find(token);
                if (token_search == node2Id.end()) {

                    node2Id[token] = (int)vocab_items.size();
                    vocab_items.push_back(Node(token));
                }

                vocab_items[node2Id[token]].count++;
                total_nodes++;

            }

        }
        fs.close();

    } else {
        cout << "An error occurred during reading file." << endl;
    }

    cout << "--> The input file has been successfully read!" << endl;
    cout << "    + The total number of nodes: " << total_nodes << endl;
    cout << "    + The total number of distinct nodes: " << vocab_items.size() << endl;
}